

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

Node * __thiscall Builder::AddTarget(Builder *this,string *name,string *err)

{
  StringPiece path;
  bool bVar1;
  Node *target;
  Node *pNVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  path.str_ = (name->_M_dataplus)._M_p;
  path.len_ = name->_M_string_length;
  target = State::LookupNode(this->state_,path);
  if (target == (Node *)0x0) {
    std::operator+(&local_60,"unknown target: \'",name);
    std::operator+(&local_40,&local_60,"\'");
    std::__cxx11::string::operator=((string *)err,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    pNVar2 = (Node *)0x0;
  }
  else {
    bVar1 = AddTarget(this,target,err);
    pNVar2 = (Node *)0x0;
    if (bVar1) {
      pNVar2 = target;
    }
  }
  return pNVar2;
}

Assistant:

Node* Builder::AddTarget(const string& name, string* err) {
  Node* node = state_->LookupNode(name);
  if (!node) {
    *err = "unknown target: '" + name + "'";
    return NULL;
  }
  if (!AddTarget(node, err))
    return NULL;
  return node;
}